

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::mouseMoveEvent(QGraphicsView *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QGraphicsViewPrivate *pQVar4;
  QScrollBar *pQVar5;
  QMouseEvent *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar6;
  QScrollBar *vBar;
  QScrollBar *hBar;
  QGraphicsViewPrivate *d;
  QPoint delta;
  QAbstractScrollArea *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QPointF *in_stack_ffffffffffffff80;
  int value;
  undefined4 in_stack_ffffffffffffff88;
  QGraphicsViewPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QGraphicsView *)0xa3e315);
  if ((pQVar4->dragMode == ScrollHandDrag) && ((*(uint *)&pQVar4->field_0x300 >> 9 & 1) != 0)) {
    pQVar5 = QAbstractScrollArea::horizontalScrollBar(in_stack_ffffffffffffff70);
    value = (int)((ulong)pQVar5 >> 0x20);
    pQVar5 = QAbstractScrollArea::verticalScrollBar(in_stack_ffffffffffffff70);
    QSinglePointEvent::position((QSinglePointEvent *)0xa3e37d);
    QPointF::toPoint(in_stack_ffffffffffffff80);
    QEventStorage<QMouseEvent>::operator->(&pQVar4->lastMouseEvent);
    QVar6 = QSinglePointEvent::position((QSinglePointEvent *)0xa3e3b4);
    in_stack_ffffffffffffffc0 = (QGraphicsViewPrivate *)QVar6.xp;
    QPointF::toPoint(in_stack_ffffffffffffff80);
    ::operator-((QPoint *)in_stack_ffffffffffffff80,
                (QPoint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar3 = QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff70);
    bVar2 = QWidget::isRightToLeft((QWidget *)0xa3e40b);
    if (bVar2) {
      QPoint::x((QPoint *)0xa3e41e);
    }
    else {
      QPoint::x((QPoint *)0xa3e431);
    }
    QAbstractSlider::setValue((QAbstractSlider *)CONCAT44(iVar3,in_stack_ffffffffffffff88),value);
    QAbstractSlider::value(&pQVar5->super_QAbstractSlider);
    QPoint::y((QPoint *)0xa3e474);
    QAbstractSlider::setValue((QAbstractSlider *)CONCAT44(iVar3,in_stack_ffffffffffffff88),value);
    pQVar4->handScrollMotions = pQVar4->handScrollMotions + 1;
  }
  QGraphicsViewPrivate::mouseMoveEventHandler(in_stack_ffffffffffffffc0,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

    if (d->dragMode == QGraphicsView::ScrollHandDrag) {
        if (d->handScrolling) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            QPoint delta = event->position().toPoint() - d->lastMouseEvent->position().toPoint();
            hBar->setValue(hBar->value() + (isRightToLeft() ? delta.x() : -delta.x()));
            vBar->setValue(vBar->value() - delta.y());

            // Detect how much we've scrolled to disambiguate scrolling from
            // clicking.
            ++d->handScrollMotions;
        }
    }

    d->mouseMoveEventHandler(event);
}